

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowNaiveState::FlushStates(WindowNaiveState *this,WindowAggregatorGlobalState *gsink)

{
  pointer pWVar1;
  FunctionData *ptr_p;
  Vector *pVVar2;
  idx_t iVar3;
  long in_RSI;
  long in_RDI;
  AggregateInputData aggr_input_data;
  AggregateObject *aggr;
  DataChunk *scanned;
  DataChunk *in_stack_00000058;
  DataChunk *in_stack_00000060;
  AggregateObject *in_stack_ffffffffffffffb0;
  code *pcVar4;
  optional_ptr<duckdb::FunctionData,_true> local_40;
  AggregateInputData local_38;
  long local_20;
  DataChunk *local_18;
  long local_10;
  
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    local_10 = in_RSI;
    pWVar1 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
             operator->((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                         *)in_stack_ffffffffffffffb0);
    local_18 = &pWVar1->chunk;
    DataChunk::Slice(in_stack_00000060,in_stack_00000058,(SelectionVector *)this,(idx_t)gsink,
                     (idx_t)scanned);
    local_20 = local_10 + 0x60;
    ptr_p = AggregateObject::GetFunctionData(in_stack_ffffffffffffffb0);
    optional_ptr<duckdb::FunctionData,_true>::optional_ptr(&local_40,ptr_p);
    AggregateInputData::AggregateInputData
              (&local_38,local_40,(ArenaAllocator *)(in_RDI + 8),PRESERVE_INPUT);
    pcVar4 = *(code **)(local_20 + 0xc0);
    pVVar2 = ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::data
                       ((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)0x1a3fb97);
    iVar3 = DataChunk::ColumnCount((DataChunk *)0x1a3fbac);
    (*pcVar4)(pVVar2,&local_38,iVar3,in_RDI + 0xe0,*(undefined8 *)(in_RDI + 0x1a0));
    *(undefined8 *)(in_RDI + 0x1a0) = 0;
  }
  return;
}

Assistant:

void WindowNaiveState::FlushStates(const WindowAggregatorGlobalState &gsink) {
	if (!flush_count) {
		return;
	}

	auto &scanned = cursor->chunk;
	leaves.Slice(scanned, update_sel, flush_count);

	const auto &aggr = gsink.aggr;
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), statep, flush_count);

	flush_count = 0;
}